

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXDocument.cpp
# Opt level: O1

vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_> *
__thiscall
Assimp::FBX::Document::GetConnectionsSequenced
          (vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
           *__return_storage_ptr__,Document *this,uint64_t id,bool is_src,ConnectionMap *conns,
          char **classnames,size_t count)

{
  Token *pTVar1;
  char *__s2;
  iterator __position;
  __normal_iterator<const_Assimp::FBX::Connection_**,_std::vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>_>
  __first;
  __normal_iterator<const_Assimp::FBX::Connection_**,_std::vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>_>
  __last;
  _Iter_comp_iter<std::_Mem_fn<bool_(Assimp::FBX::Connection::*)(const_Assimp::FBX::Connection_*)_const>_>
  __comp;
  _Iter_comp_iter<std::_Mem_fn<bool_(Assimp::FBX::Connection::*)(const_Assimp::FBX::Connection_*)_const>_>
  __comp_00;
  int iVar2;
  size_t sVar3;
  _Rb_tree_const_iterator<std::pair<const_unsigned_long,_const_Assimp::FBX::Connection_*>_> _Var4;
  LazyObject *pLVar5;
  ulong uVar6;
  undefined4 uVar7;
  undefined7 in_register_00000009;
  size_t i;
  size_t sVar8;
  size_type __n;
  long lVar9;
  pair<std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_const_Assimp::FBX::Connection_*>_>,_std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_const_Assimp::FBX::Connection_*>_>_>
  pVar10;
  size_t lengths [6];
  undefined4 in_stack_ffffffffffffff80;
  _Rb_tree_const_iterator<std::pair<const_unsigned_long,_const_Assimp::FBX::Connection_*>_> local_78
  ;
  uint64_t local_70;
  size_t asStack_68 [7];
  
  uVar7 = (undefined4)CONCAT71(in_register_00000009,is_src);
  local_70 = id;
  if (classnames == (char **)0x0) {
    __assert_fail("classnames",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/FBX/FBXDocument.cpp"
                  ,0x241,
                  "std::vector<const Connection *> Assimp::FBX::Document::GetConnectionsSequenced(uint64_t, bool, const ConnectionMap &, const char *const *, size_t) const"
                 );
  }
  if (count == 0) {
    __assert_fail("count != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/FBX/FBXDocument.cpp"
                  ,0x242,
                  "std::vector<const Connection *> Assimp::FBX::Document::GetConnectionsSequenced(uint64_t, bool, const ConnectionMap &, const char *const *, size_t) const"
                 );
  }
  if (6 < count) {
    __assert_fail("count <= 6",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/FBX/FBXDocument.cpp"
                  ,0x243,
                  "std::vector<const Connection *> Assimp::FBX::Document::GetConnectionsSequenced(uint64_t, bool, const ConnectionMap &, const char *const *, size_t) const"
                 );
  }
  sVar8 = 0;
  do {
    sVar3 = strlen(classnames[sVar8]);
    asStack_68[sVar8] = sVar3;
    sVar8 = sVar8 + 1;
  } while (count != sVar8);
  *(undefined8 *)__return_storage_ptr__ = 0;
  *(pointer *)((long)__return_storage_ptr__ + 8) = (pointer)0x0;
  *(pointer *)((long)__return_storage_ptr__ + 0x10) = (pointer)0x0;
  pVar10 = std::
           _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_const_Assimp::FBX::Connection_*>,_std::_Select1st<std::pair<const_unsigned_long,_const_Assimp::FBX::Connection_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_Assimp::FBX::Connection_*>_>_>
           ::equal_range(&conns->_M_t,&local_70);
  __n = 0;
  _Var4._M_node = pVar10.first._M_node._M_node;
  while (_Var4._M_node != pVar10.second._M_node._M_node) {
    _Var4._M_node = (_Base_ptr)std::_Rb_tree_increment(_Var4._M_node);
    __n = __n + 1;
  }
  std::vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>::
  reserve(__return_storage_ptr__,__n);
  if (pVar10.first._M_node._M_node != pVar10.second._M_node._M_node) {
    do {
      local_78 = pVar10.second._M_node;
      _Var4 = pVar10.first._M_node;
      if ((char)uVar7 == '\0') {
        pLVar5 = Connection::LazySourceObject((Connection *)_Var4._M_node[1]._M_parent);
      }
      else {
        pLVar5 = Connection::LazyDestinationObject((Connection *)_Var4._M_node[1]._M_parent);
      }
      pTVar1 = pLVar5->element->key_token;
      __s2 = pTVar1->sbegin;
      lVar9 = 0;
      do {
        if (classnames[lVar9] == (char *)0x0) {
          __assert_fail("classnames[i]",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/FBX/FBXDocument.cpp"
                        ,0x25a,
                        "std::vector<const Connection *> Assimp::FBX::Document::GetConnectionsSequenced(uint64_t, bool, const ConnectionMap &, const char *const *, size_t) const"
                       );
        }
        if (((long)pTVar1->send - (long)__s2 == asStack_68[lVar9]) &&
           (iVar2 = strncmp(classnames[lVar9],__s2,asStack_68[lVar9]), iVar2 == 0))
        goto LAB_0060897d;
        lVar9 = lVar9 + 1;
      } while (count + (count == 0) != lVar9);
      if (__s2 == (char *)0x0) {
LAB_0060897d:
        __position._M_current = *(Connection ***)((long)__return_storage_ptr__ + 8);
        if (__position._M_current == *(Connection ***)((long)__return_storage_ptr__ + 0x10)) {
          std::vector<Assimp::FBX::Connection_const*,std::allocator<Assimp::FBX::Connection_const*>>
          ::_M_realloc_insert<Assimp::FBX::Connection_const*const&>
                    ((vector<Assimp::FBX::Connection_const*,std::allocator<Assimp::FBX::Connection_const*>>
                      *)__return_storage_ptr__,__position,(Connection **)&_Var4._M_node[1]._M_parent
                    );
        }
        else {
          *__position._M_current = (Connection *)_Var4._M_node[1]._M_parent;
          *(long *)((long)__return_storage_ptr__ + 8) =
               *(long *)((long)__return_storage_ptr__ + 8) + 8;
        }
      }
      _Var4._M_node = (_Base_ptr)std::_Rb_tree_increment(_Var4._M_node);
      pVar10.second._M_node = local_78._M_node;
      pVar10.first._M_node = _Var4._M_node;
    } while (_Var4._M_node != local_78._M_node);
  }
  __first._M_current = *(Connection ***)__return_storage_ptr__;
  __last._M_current = *(Connection ***)((long)__return_storage_ptr__ + 8);
  if (__first._M_current != __last._M_current) {
    uVar6 = (long)__last._M_current - (long)__first._M_current >> 3;
    lVar9 = 0x3f;
    if (uVar6 != 0) {
      for (; uVar6 >> lVar9 == 0; lVar9 = lVar9 + -1) {
      }
    }
    __comp._M_comp.
    super__Mem_fn_base<bool_(Assimp::FBX::Connection::*)(const_Assimp::FBX::Connection_*)_const,_true>
    ._8_4_ = in_stack_ffffffffffffff80;
    __comp._M_comp.
    super__Mem_fn_base<bool_(Assimp::FBX::Connection::*)(const_Assimp::FBX::Connection_*)_const,_true>
    ._M_pmf = (offset_in_Connection_to_subr)__return_storage_ptr__;
    __comp._M_comp.
    super__Mem_fn_base<bool_(Assimp::FBX::Connection::*)(const_Assimp::FBX::Connection_*)_const,_true>
    ._12_4_ = uVar7;
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<Assimp::FBX::Connection_const**,std::vector<Assimp::FBX::Connection_const*,std::allocator<Assimp::FBX::Connection_const*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<std::_Mem_fn<bool(Assimp::FBX::Connection::*)(Assimp::FBX::Connection_const*)const>>>
              (__first,__last,(ulong)(((uint)lVar9 ^ 0x3f) * 2) ^ 0x7e,__comp);
    __comp_00._M_comp.
    super__Mem_fn_base<bool_(Assimp::FBX::Connection::*)(const_Assimp::FBX::Connection_*)_const,_true>
    ._8_4_ = in_stack_ffffffffffffff80;
    __comp_00._M_comp.
    super__Mem_fn_base<bool_(Assimp::FBX::Connection::*)(const_Assimp::FBX::Connection_*)_const,_true>
    ._M_pmf = (offset_in_Connection_to_subr)__return_storage_ptr__;
    __comp_00._M_comp.
    super__Mem_fn_base<bool_(Assimp::FBX::Connection::*)(const_Assimp::FBX::Connection_*)_const,_true>
    ._12_4_ = uVar7;
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<Assimp::FBX::Connection_const**,std::vector<Assimp::FBX::Connection_const*,std::allocator<Assimp::FBX::Connection_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::_Mem_fn<bool(Assimp::FBX::Connection::*)(Assimp::FBX::Connection_const*)const>>>
              (__first,__last,__comp_00);
  }
  return (vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
          *)(vector<Assimp::FBX::Connection_const*,std::allocator<Assimp::FBX::Connection_const*>> *
            )__return_storage_ptr__;
}

Assistant:

std::vector<const Connection*> Document::GetConnectionsSequenced(uint64_t id, bool is_src,
    const ConnectionMap& conns,
    const char* const* classnames,
    size_t count) const

{
    ai_assert(classnames);
    ai_assert( count != 0 );
    ai_assert( count <= MAX_CLASSNAMES);

    size_t lengths[MAX_CLASSNAMES];

    const size_t c = count;
    for (size_t i = 0; i < c; ++i) {
        lengths[ i ] = strlen(classnames[i]);
    }

    std::vector<const Connection*> temp;
    const std::pair<ConnectionMap::const_iterator,ConnectionMap::const_iterator> range =
        conns.equal_range(id);

    temp.reserve(std::distance(range.first,range.second));
    for (ConnectionMap::const_iterator it = range.first; it != range.second; ++it) {
        const Token& key = (is_src
            ? (*it).second->LazyDestinationObject()
            : (*it).second->LazySourceObject()
        ).GetElement().KeyToken();

        const char* obtype = key.begin();

        for (size_t i = 0; i < c; ++i) {
            ai_assert(classnames[i]);
            if(static_cast<size_t>(std::distance(key.begin(),key.end())) == lengths[i] && !strncmp(classnames[i],obtype,lengths[i])) {
                obtype = nullptr;
                break;
            }
        }

        if(obtype) {
            continue;
        }

        temp.push_back((*it).second);
    }

    std::sort(temp.begin(), temp.end(), std::mem_fn(&Connection::Compare));
    return temp; // NRVO should handle this
}